

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O3

int32_t ucnv_extSimpleMatchFromU_63(int32_t *cx,UChar32 cp,uint32_t *pValue,UBool useFallback)

{
  int32_t iVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint uVar3;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar1 = ucnv_extMatchFromU(cx,cp,(UChar *)0x0,0,(UChar *)0x0,0,&local_14,useFallback,'\x01');
  uVar3 = 0;
  if (1 < iVar1) {
    uVar2 = local_14 >> 0x18 & 0x1f;
    if (uVar2 < 4) {
      *pValue = local_14 & 0xffffff;
      uVar3 = -uVar2;
      if ((int)local_14 < 0) {
        uVar3 = uVar2;
      }
    }
  }
  return uVar3;
}

Assistant:

U_CFUNC int32_t
ucnv_extSimpleMatchFromU(const int32_t *cx,
                         UChar32 cp, uint32_t *pValue,
                         UBool useFallback) {
    uint32_t value;
    int32_t match;

    /* try to match */
    match=ucnv_extMatchFromU(cx,
                             cp,
                             NULL, 0,
                             NULL, 0,
                             &value,
                             useFallback, TRUE);
    if(match>=2) {
        /* write result for simple, single-character conversion */
        int32_t length;
        int isRoundtrip;

        isRoundtrip=UCNV_EXT_FROM_U_IS_ROUNDTRIP(value);
        length=UCNV_EXT_FROM_U_GET_LENGTH(value);
        value=(uint32_t)UCNV_EXT_FROM_U_GET_DATA(value);

        if(length<=UCNV_EXT_FROM_U_MAX_DIRECT_LENGTH) {
            *pValue=value;
            return isRoundtrip ? length : -length;
#if 0 /* not currently used */
        } else if(length==4) {
            /* de-serialize a 4-byte result */
            const uint8_t *result=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_BYTES_INDEX, uint8_t)+value;
            *pValue=
                ((uint32_t)result[0]<<24)|
                ((uint32_t)result[1]<<16)|
                ((uint32_t)result[2]<<8)|
                result[3];
            return isRoundtrip ? 4 : -4;
#endif
        }
    }

    /*
     * return no match because
     * - match>1 && resultLength>4: result too long for simple conversion
     * - match==1: no match found, <subchar1> preferred
     * - match==0: no match found in the first place
     * - match<0: partial match, not supported for simple conversion (and flush==TRUE)
     */
    return 0;
}